

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O1

void Js::ByteCodeDumper::
     DumpReg5U<Js::OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
               (OpCode op,OpLayoutT_Reg5U<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  code *pcVar5;
  bool bVar6;
  int iVar7;
  undefined8 in_RAX;
  FunctionProxy *this;
  ParseableFunctionInfo *pPVar8;
  undefined4 extraout_var;
  undefined4 *puVar9;
  undefined6 in_register_0000003a;
  undefined4 uVar10;
  
  uVar10 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((int)CONCAT62(in_register_0000003a,op) == 0x165) {
    this = ParseableFunctionInfo::GetNestedFunctionProxy
                     (&dumpFunction->super_ParseableFunctionInfo,(uint)data->SlotIndex);
    bVar1 = data->R0;
    bVar2 = data->R1;
    bVar3 = data->R2;
    bVar4 = data->R3;
    pPVar8 = FunctionProxy::EnsureDeserialized(this);
    iVar7 = (*(pPVar8->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])(pPVar8);
    Output::Print(L" R%d, R%d = R%d, R%d, %s(), env:R%d",(ulong)bVar1,(ulong)bVar2,(ulong)bVar3,
                  (ulong)bVar4,CONCAT44(extraout_var,iVar7),CONCAT44(uVar10,(uint)data->R4));
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                ,0x56a,"(false)","Unknown Reg5U opcode");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  return;
}

Assistant:

void
    ByteCodeDumper::DumpReg5U(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case Js::OpCode::InitInnerClass:
            {
                FunctionProxy* pfuncActual = dumpFunction->GetNestedFunctionProxy((uint)data->SlotIndex);
                Output::Print(_u(" R%d, R%d = R%d, R%d, %s(), env:R%d"), data->R0, data->R1, data->R2, data->R3,
                    pfuncActual->EnsureDeserialized()->GetDisplayName(), data->R4);
                break;
            }

            default:
                AssertMsg(false, "Unknown Reg5U opcode");
                break;
        }
    }